

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::CommandReporter::getCommandLine
          (string *__return_storage_ptr__,CommandReporter *this,string *received,string *approved)

{
  CommandLauncher *pCVar1;
  string local_38;
  
  pCVar1 = this->l;
  assembleFullCommand(&local_38,this,received,approved);
  (*pCVar1->_vptr_CommandLauncher[3])(__return_storage_ptr__,pCVar1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandReporter::getCommandLine(const std::string& received,
                                                const std::string& approved) const
    {
        return l->getCommandLine(assembleFullCommand(received, approved));
    }